

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O3

void __thiscall adios2::transport::FileStdio::SetBuffer(FileStdio *this,char *buffer,size_t size)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  FILE *__stream;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __stream = (FILE *)this->m_File;
  if (__stream == (FILE *)0x0) {
    this->m_DelayedBufferSet = true;
    this->m_DelayedBuffer = buffer;
    this->m_DelayedBufferSize = size;
  }
  else {
    this->m_DelayedBufferSet = false;
    this->m_DelayedBuffer = (char *)0x0;
    this->m_DelayedBufferSize = 0;
    if (buffer == (char *)0x0) {
      if (size != 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Toolkit","");
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"transport::file::FileStdio","");
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SetBuffer","");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"buffer size must be 0 when using a NULL buffer","");
        helper::Throw<std::invalid_argument>(&local_68,&local_88,&local_a8,&local_c8,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        __stream = (FILE *)this->m_File;
      }
      buffer = (char *)0x0;
      iVar1 = 2;
      size = 0;
    }
    else {
      iVar1 = 0;
    }
    iVar1 = setvbuf(__stream,buffer,iVar1,size);
    if (iVar1 != 0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Toolkit","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"transport::file::FileStdio","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SetBuffer","");
      std::operator+(&local_48,"could not set FILE* buffer in file ",&(this->super_Transport).m_Name
                    );
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_c8.field_2._M_allocated_capacity = *psVar3;
        local_c8.field_2._8_8_ = plVar2[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar3;
        local_c8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_c8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_68,&local_88,&local_a8,&local_c8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void FileStdio::SetBuffer(char *buffer, size_t size)
{
    if (!m_File)
    {
        m_DelayedBufferSet = true;
        m_DelayedBuffer = buffer;
        m_DelayedBufferSize = size;
        return;
    }
    m_DelayedBufferSet = false;
    m_DelayedBuffer = nullptr;
    m_DelayedBufferSize = 0;

    int status;
    if (buffer)
    {
        status = std::setvbuf(m_File, buffer, _IOFBF, size);
    }
    else
    {
        if (size != 0)
        {
            helper::Throw<std::invalid_argument>("Toolkit", "transport::file::FileStdio",
                                                 "SetBuffer",
                                                 "buffer size must be 0 when using a NULL buffer");
        }
        status = std::setvbuf(m_File, NULL, _IONBF, 0);
    }

    if (status)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "SetBuffer",
                                              "could not set FILE* buffer in file " + m_Name +
                                                  ", in call to stdio setvbuf");
    }
}